

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall asl::Array<asl::Socket>::free(Array<asl::Socket> *this,void *__ptr)

{
  asl_destroy<asl::Socket>(this->_a,*(int *)&this->_a[-2].super_SmartObject._p);
  ::free(this->_a + -2);
  this->_a = (Socket *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}